

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Expression * __thiscall
soul::heart::Parser::parseSuffixOperators(Parser *this,FunctionParseState *state,Expression *lhs)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Structure *this_00;
  Module *pMVar4;
  StructElement *lhs_00;
  string *args;
  undefined4 extraout_var_01;
  Expression *pEVar5;
  int64_t iVar6;
  ArraySize end;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ArrayElement *lhs_01;
  int64_t end_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string_view memberName;
  string member;
  Value constStart;
  Value local_120;
  Value local_e0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x29b542);
  if (bVar1) {
    readGeneralIdentifier_abi_cxx11_((string *)&local_120,this);
    iVar2 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
    if (*(char *)CONCAT44(extraout_var,iVar2) != '\x06') {
      Errors::invalidDotArguments<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_e0);
      CompileMessage::~CompileMessage((CompileMessage *)&local_e0);
    }
    iVar2 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
    this_00 = Type::getStructRef((Type *)CONCAT44(extraout_var_00,iVar2));
    memberName._M_str._4_4_ = local_120.type.primitiveType.type;
    memberName._M_str._0_1_ = local_120.type.category;
    memberName._M_str._1_1_ = local_120.type.arrayElementCategory;
    memberName._M_str._2_1_ = local_120.type.isRef;
    memberName._M_str._3_1_ = local_120.type.isConstant;
    memberName._M_len._0_4_ = local_120.type.boundingSize;
    memberName._M_len._4_4_ = local_120.type.arrayElementBoundingSize;
    bVar1 = Structure::hasMemberWithName(this_00,memberName);
    if (bVar1) {
      pMVar4 = pool_ptr<soul::Module>::operator->(&this->module);
      lhs_00 = Module::
               allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string&>
                         (pMVar4,&(this->
                                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                  ).location,lhs,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_120);
      args = (string *)parseSuffixOperators(this,state,&lhs_00->super_Expression);
    }
    else {
      args = &this_00->name;
      Errors::unknownMemberInStruct<std::__cxx11::string&,std::__cxx11::string_const&>
                ((CompileMessage *)&local_e0,(Errors *)&local_120,args,in_RCX);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_e0);
      CompileMessage::~CompileMessage((CompileMessage *)&local_e0);
    }
    std::__cxx11::string::~string((string *)&local_120);
    if (bVar1) {
      return (Expression *)args;
    }
  }
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x29b4de);
  if (bVar1) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x275274);
    if (bVar1) {
      iVar3 = parseInt32(this);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x29aa2b);
      lhs = parseArraySlice(this,state,lhs,0,(long)iVar3);
    }
    else {
      iVar2 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
      pEVar5 = parseExpression(this,state);
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x275274);
      if (bVar1) {
        (*(pEVar5->super_Object)._vptr_Object[7])(&local_e0,pEVar5);
        if ((1 < local_e0.type.primitiveType.type - int32) || (local_e0.type.category != primitive))
        {
          Errors::nonConstArraySize<>();
          (*(this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser[2])(this,&local_120);
          CompileMessage::~CompileMessage((CompileMessage *)&local_120);
        }
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x29aa2b);
        if (bVar1) {
          iVar6 = soul::Value::getAsInt64(&local_e0);
          end = Type::getArrayOrVectorSize((Type *)CONCAT44(extraout_var_01,iVar2));
          lhs = parseArraySlice(this,state,lhs,iVar6,end);
        }
        else {
          pEVar5 = parseExpression(this,state);
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x29aa2b);
          (*(pEVar5->super_Object)._vptr_Object[7])(&local_120,pEVar5);
          if ((1 < local_120.type.primitiveType.type - int32) ||
             (local_120.type.category != primitive)) {
            Errors::nonConstArraySize<>();
            (*(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              )._vptr_Tokeniser[2])(this,&local_a0);
            CompileMessage::~CompileMessage(&local_a0);
          }
          iVar6 = soul::Value::getAsInt64(&local_e0);
          end_00 = soul::Value::getAsInt64(&local_120);
          lhs = parseArraySlice(this,state,lhs,iVar6,end_00);
          soul::Value::~Value(&local_120);
        }
        soul::Value::~Value(&local_e0);
      }
      else {
        iVar2 = (*(pEVar5->super_Object)._vptr_Object[2])(pEVar5);
        if (((1 < *(int *)((char *)CONCAT44(extraout_var_02,iVar2) + 4) - 7U) ||
            (*(char *)CONCAT44(extraout_var_02,iVar2) != '\x01')) &&
           (iVar2 = (*(pEVar5->super_Object)._vptr_Object[2])(pEVar5),
           (*(byte *)CONCAT44(extraout_var_03,iVar2) & 0xfe) != 4)) {
          Errors::nonIntegerArrayIndex<>();
          (*(this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser[2])(this,&local_e0);
          CompileMessage::~CompileMessage((CompileMessage *)&local_e0);
        }
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchAndReplaceIf<soul::TokenType,soul::TokenType>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)this,(TokenType)0x275af2,(TokenType)0x29aa2b);
        if (!bVar1) {
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x29aa2b);
          iVar2 = (*(lhs->super_Object)._vptr_Object[2])(lhs);
          if ((*(byte *)CONCAT44(extraout_var_04,iVar2) & 0xfe) != 2) {
            Errors::expectedArrayOrVector<>();
            CodeLocation::throwError
                      (&(this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ).location,&local_68);
          }
        }
        pMVar4 = pool_ptr<soul::Module>::operator->(&this->module);
        lhs_01 = Module::
                 allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&>
                           (pMVar4,&(this->
                                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                    ).location,lhs,pEVar5);
        lhs = parseSuffixOperators(this,state,&lhs_01->super_Expression);
      }
    }
  }
  return lhs;
}

Assistant:

heart::Expression& parseSuffixOperators (const FunctionParseState& state, heart::Expression& lhs)
    {
        if (matchIf (HEARTOperator::dot))
        {
            auto member = readGeneralIdentifier();

            if (! lhs.getType().isStruct())
                throwError (Errors::invalidDotArguments());

            auto& structure = lhs.getType().getStructRef();

            if (structure.hasMemberWithName (member))
                return parseSuffixOperators (state, module->allocate<heart::StructElement> (location, lhs, member));

            throwError (Errors::unknownMemberInStruct (member, structure.getName()));
        }

        if (matchIf (HEARTOperator::openBracket))
        {
            if (matchIf (HEARTOperator::colon))
            {
                auto endIndex = parseInt32();
                expect (HEARTOperator::closeBracket);
                return parseArraySlice (state, lhs, 0, endIndex);
            }

            const auto& arrayOrVectorType = lhs.getType();

            auto& startIndex = parseExpression (state);

            if (matchIf (HEARTOperator::colon))
            {
                auto constStart = startIndex.getAsConstant();

                if (! constStart.getType().isPrimitiveInteger())
                    throwError (Errors::nonConstArraySize());

                if (matchIf (HEARTOperator::closeBracket))
                    return parseArraySlice (state, lhs, constStart.getAsInt64(),
                                            (int64_t) arrayOrVectorType.getArrayOrVectorSize());

                auto& endIndex = parseExpression (state);
                expect (HEARTOperator::closeBracket);

                auto constEnd = endIndex.getAsConstant();

                if (! constEnd.getType().isPrimitiveInteger())
                    throwError (Errors::nonConstArraySize());

                return parseArraySlice (state, lhs, constStart.getAsInt64(), constEnd.getAsInt64());
            }

            if (! (startIndex.getType().isPrimitiveInteger() || startIndex.getType().isBoundedInt()))
                throwError (Errors::nonIntegerArrayIndex());

            if (matchAndReplaceIf (HEARTOperator::closeDoubleBracket, HEARTOperator::closeBracket))
                return parseSuffixOperators (state, module->allocate<heart::ArrayElement> (location, lhs, startIndex));

            expect (HEARTOperator::closeBracket);

            if (! lhs.getType().isArrayOrVector())
                location.throwError (Errors::expectedArrayOrVector());

            return parseSuffixOperators (state, module->allocate<heart::ArrayElement> (location, lhs, startIndex));
        }

        return lhs;
    }